

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall
ChainstateManager::UpdateUncommittedBlockStructures
          (ChainstateManager *this,CBlock *block,CBlockIndex *pindexPrev)

{
  pointer psVar1;
  element_type *peVar2;
  pointer pCVar3;
  char *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  CTransaction *pCVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  size_type *psVar7;
  pointer puVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  CMutableTransaction tx;
  CTransaction *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  CMutableTransaction local_68;
  undefined1 local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar13 = true;
  if (psVar1 != (block->vtx).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    peVar2 = (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pCVar3;
    if (lVar10 != 0) {
      lVar10 = (lVar10 >> 3) * -0x3333333333333333;
      psVar7 = (size_type *)((long)&pCVar3->scriptPubKey + 0x1c);
      uVar11 = 0xffffffff;
      uVar12 = 0;
      do {
        if (((((0x42 < *psVar7) &&
              (pcVar4 = *(char **)&((CScriptBase *)(psVar7 + -7))->_union, *pcVar4 == 'j')) &&
             (pcVar4[1] == '$')) && ((pcVar4[2] == -0x56 && (pcVar4[3] == '!')))) &&
           ((pcVar4[4] == -0x57 && (pcVar4[5] == -0x13)))) {
          uVar11 = uVar12 & 0xffffffff;
        }
        uVar12 = uVar12 + 1;
        psVar7 = psVar7 + 10;
      } while (lVar10 + (ulong)(lVar10 == 0) != uVar12);
      bVar13 = (int)uVar11 == -1;
    }
  }
  if (UpdateUncommittedBlockStructures(CBlock&,CBlockIndex_const*)::nonce == '\0') {
    iVar9 = __cxa_guard_acquire(&UpdateUncommittedBlockStructures(CBlock&,CBlockIndex_const*)::nonce
                               );
    if (iVar9 != 0) {
      UpdateUncommittedBlockStructures::nonce.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      UpdateUncommittedBlockStructures::nonce.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      UpdateUncommittedBlockStructures::nonce.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar8 = (pointer)operator_new(0x20);
      UpdateUncommittedBlockStructures::nonce.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar8 + 0x20;
      UpdateUncommittedBlockStructures::nonce.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar8;
      UpdateUncommittedBlockStructures::nonce.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           UpdateUncommittedBlockStructures::nonce.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar8[0x10] = '\0';
      puVar8[0x11] = '\0';
      puVar8[0x12] = '\0';
      puVar8[0x13] = '\0';
      puVar8[0x14] = '\0';
      puVar8[0x15] = '\0';
      puVar8[0x16] = '\0';
      puVar8[0x17] = '\0';
      puVar8[0x18] = '\0';
      puVar8[0x19] = '\0';
      puVar8[0x1a] = '\0';
      puVar8[0x1b] = '\0';
      puVar8[0x1c] = '\0';
      puVar8[0x1d] = '\0';
      puVar8[0x1e] = '\0';
      puVar8[0x1f] = '\0';
      puVar8[0] = '\0';
      puVar8[1] = '\0';
      puVar8[2] = '\0';
      puVar8[3] = '\0';
      puVar8[4] = '\0';
      puVar8[5] = '\0';
      puVar8[6] = '\0';
      puVar8[7] = '\0';
      puVar8[8] = '\0';
      puVar8[9] = '\0';
      puVar8[10] = '\0';
      puVar8[0xb] = '\0';
      puVar8[0xc] = '\0';
      puVar8[0xd] = '\0';
      puVar8[0xe] = '\0';
      puVar8[0xf] = '\0';
      __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                   &UpdateUncommittedBlockStructures::nonce,&__dso_handle);
      __cxa_guard_release(&UpdateUncommittedBlockStructures(CBlock&,CBlockIndex_const*)::nonce);
    }
  }
  if (!bVar13) {
    if (pindexPrev == (CBlockIndex *)0x0) {
      iVar9 = 0;
    }
    else {
      iVar9 = pindexPrev->nHeight + 1;
    }
    if (((((this->m_options).chainparams)->consensus).SegwitHeight <= iVar9) &&
       (psVar1 = (block->vtx).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       ((psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_has_witness == false)) {
      CMutableTransaction::CMutableTransaction
                (&local_68,
                 (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                );
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::resize(&((local_68.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptWitness).stack,1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (((local_68.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start)->scriptWitness).stack.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,&UpdateUncommittedBlockStructures::nonce)
      ;
      local_78 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
                (&_Stack_70,&local_78,(allocator<CTransaction> *)&local_29,&local_68);
      _Var6._M_pi = _Stack_70._M_pi;
      pCVar5 = local_78;
      psVar1 = (block->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_78 = (CTransaction *)0x0;
      _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pCVar5;
      (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
           = _Var6._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_68.vout);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_68.vin);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ChainstateManager::UpdateUncommittedBlockStructures(CBlock& block, const CBlockIndex* pindexPrev) const
{
    int commitpos = GetWitnessCommitmentIndex(block);
    static const std::vector<unsigned char> nonce(32, 0x00);
    if (commitpos != NO_WITNESS_COMMITMENT && DeploymentActiveAfter(pindexPrev, *this, Consensus::DEPLOYMENT_SEGWIT) && !block.vtx[0]->HasWitness()) {
        CMutableTransaction tx(*block.vtx[0]);
        tx.vin[0].scriptWitness.stack.resize(1);
        tx.vin[0].scriptWitness.stack[0] = nonce;
        block.vtx[0] = MakeTransactionRef(std::move(tx));
    }
}